

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsImageElement.cpp
# Opt level: O2

void __thiscall KDReports::ImageElement::ImageElement(ImageElement *this,ImageElement *other)

{
  ImageElementPrivate *this_00;
  
  Element::Element(&this->super_Element,&other->super_Element);
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__ImageElement_00170328;
  this_00 = (ImageElementPrivate *)operator_new(0x58);
  ImageElementPrivate::ImageElementPrivate
            (this_00,(other->d)._M_t.
                     super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
                     .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl);
  (this->d)._M_t.
  super___uniq_ptr_impl<KDReports::ImageElementPrivate,_std::default_delete<KDReports::ImageElementPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::ImageElementPrivate_*,_std::default_delete<KDReports::ImageElementPrivate>_>
  .super__Head_base<0UL,_KDReports::ImageElementPrivate_*,_false>._M_head_impl = this_00;
  return;
}

Assistant:

KDReports::ImageElement::ImageElement(const ImageElement &other)
    : Element(other)
    , d(new ImageElementPrivate(*other.d))
{
}